

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.hpp
# Opt level: O0

void __thiscall Flag::Flag<char_const*,char_const*>(Flag *this,char *identifier,char *identifier_1)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 __s [8];
  char *__s_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8f;
  undefined1 local_8e;
  allocator<char> local_8d [20];
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  char *identifier_local_1;
  char *identifier_local;
  Flag *this_local;
  
  local_20 = (undefined1  [8])identifier_1;
  identifier_local_1 = identifier;
  identifier_local = (char *)this;
  Switch::Switch(&this->super_Switch);
  __s_00 = identifier_local_1;
  (this->super_Switch)._vptr_Switch = (_func_int **)&PTR_identifiers_abi_cxx11__0012c878;
  local_8e = 1;
  local_78 = &local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s_00,&local_79);
  __s = local_20;
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,(char *)__s,local_8d);
  local_8e = 0;
  local_30 = &local_70;
  local_28 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_8f);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ids,__l,&local_8f);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_8f);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30;
  do {
    local_e0 = local_e0 + -1;
    std::__cxx11::string::~string((string *)local_e0);
  } while (local_e0 != &local_70);
  std::allocator<char>::~allocator(local_8d);
  std::allocator<char>::~allocator(&local_79);
  return;
}

Assistant:

explicit Flag(const T ...identifier) : ids { identifier... } {
        static_assert(sizeof...(T) >= 1, "At least one identifier must be provided");
    }